

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_test.c
# Opt level: O0

bool_t zzTestEtc(void)

{
  u32 seed;
  int iVar1;
  bool_t bVar2;
  size_t sVar3;
  void *buf;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  octet stack [2048];
  octet combo_state [32];
  word t [8];
  word b [16];
  word a [8];
  size_t reps2;
  size_t reps1;
  size_t in_stack_fffffffffffff6b0;
  undefined1 *state;
  size_t in_stack_fffffffffffff6c8;
  word *in_stack_fffffffffffff6d0;
  void *in_stack_fffffffffffff6d8;
  word *in_stack_fffffffffffff6e0;
  word *in_stack_fffffffffffff6e8;
  word *in_stack_fffffffffffff6f0;
  undefined1 local_138 [32];
  ulong local_118 [8];
  word local_d8 [16];
  word local_58 [8];
  long local_18;
  long local_10;
  
  local_10 = 500;
  local_18 = 500;
  sVar3 = prngCOMBO_keep();
  if (sVar3 < 0x21) {
    sVar3 = zzSqr_deep(8);
    buf = (void *)zzSqrt_deep(in_stack_fffffffffffff6b0);
    sVar4 = zzJacobi_deep((size_t)buf,sVar3);
    sVar4 = utilMax(3,sVar3,buf,sVar4);
    if (sVar4 < 0x801) {
      state = local_138;
      seed = utilNonce32();
      prngCOMBOStart(state,seed);
      while (lVar5 = local_10 + -1, bVar6 = local_10 != 0, local_10 = lVar5, bVar6) {
        prngCOMBOStepR(buf,sVar3,state);
        zzSqr(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,(size_t)in_stack_fffffffffffff6e0,
              in_stack_fffffffffffff6d8);
        prngCOMBOStepR(buf,sVar3,state);
        local_118[0] = local_118[0] | 1;
        iVar1 = zzJacobi(in_stack_fffffffffffff6e0,(size_t)in_stack_fffffffffffff6d8,
                         in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,buf);
        if (iVar1 == -1) {
          return 0;
        }
      }
      do {
        do {
          if (local_18 == 0) {
            return 1;
          }
          local_18 = local_18 + -1;
          prngCOMBOStepR(buf,sVar3,state);
          zzSqr(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                (size_t)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
          zzSqrt(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                 (size_t)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
          bVar2 = wwEq(local_58,local_118,8);
          if (bVar2 == 0) {
            return 0;
          }
          zzAddW2(local_d8,0x10,1);
          zzSqrt(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                 (size_t)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
          bVar2 = wwEq(local_58,local_118,8);
          if (bVar2 == 0) {
            return 0;
          }
          bVar2 = wwIsZero(local_58,8);
        } while (bVar2 != 0);
        zzSubW2(local_d8,0x10,2);
        zzSqrt(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,(size_t)in_stack_fffffffffffff6d8
               ,in_stack_fffffffffffff6d0);
        bVar2 = wwEq(local_58,local_118,8);
        if (bVar2 != 0) {
          return 0;
        }
        bVar2 = zzIsSumWEq(local_58,local_118,8,1);
      } while (bVar2 != 0);
      return 0;
    }
  }
  return 0;
}

Assistant:

static bool_t zzTestEtc()
{
	enum { n = 8 };
	size_t reps1 = 500;
	size_t reps2 = 500;
	word a[n];
	word b[2 * n];
	word t[(2 * n + 1) / 2];
	octet combo_state[32];
	octet stack[2048];
	// подготовить память
	if (sizeof(combo_state) < prngCOMBO_keep() ||
		sizeof(stack) < utilMax(3,
			zzSqr_deep(n),
			zzSqrt_deep(n),
			zzJacobi_deep(2 * n, n)))
		return FALSE;
	// инициализировать генератор COMBO
	prngCOMBOStart(combo_state, utilNonce32());
	// символ Якоби
	while (reps1--)
	{
		prngCOMBOStepR(a, O_OF_W(n), combo_state);
		zzSqr(b, a, n, stack);
		prngCOMBOStepR(t, O_OF_W(n), combo_state);
		t[0] |= 1;
		// (a^2 / t) != -1?
		if (zzJacobi(b, 2 * n, t, n, stack) == -1)
			return FALSE;
	}
	// квадратные корни
	while (reps2--)
	{
		prngCOMBOStepR(a, O_OF_W(n), combo_state);
		// sqrt(a^2) == a?
		zzSqr(b, a, n, stack);
		zzSqrt(t, b, 2 * n, stack);
		if (!wwEq(a, t, n))
			return FALSE;
		// sqrt(a^2 + 1) == a?
		zzAddW2(b, 2 * n, 1);
		zzSqrt(t, b, 2 * n, stack);
		if (!wwEq(a, t, n))
			return FALSE;
		// sqrt(a^2 - 1) + 1 == a?
		if (wwIsZero(a, n))
			continue;
		zzSubW2(b, 2 * n, 2);
		zzSqrt(t, b, 2 * n, stack);
		if (wwEq(a, t, n))
			return FALSE;
		if (!zzIsSumWEq(a, t, n, 1))
			return FALSE;
	}
	return TRUE;

}